

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

long cs_impl::to_integer_if<std::pair<cs_impl::any,_cs_impl::any>,_false>::to_integer
               (pair<cs_impl::any,_cs_impl::any> *param_1)

{
  error *this;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  this = (error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"E000M",&local_29);
  cov::error::error(this,in_stack_ffffffffffffffa8);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

static long to_integer(const T &)
		{
			throw cov::error("E000M");
		}